

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O2

void __thiscall Assimp::CalcTangentsProcess::Execute(CalcTangentsProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  byte bVar3;
  uint a;
  ulong uVar4;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/CalcTangentsProcess.cpp"
                  ,0x60,"virtual void Assimp::CalcTangentsProcess::Execute(aiScene *)");
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"CalcTangentsProcess begin");
  bVar3 = 0;
  for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
    bVar1 = ProcessMesh(this,pScene->mMeshes[uVar4],(uint)uVar4);
    bVar3 = bVar3 | bVar1;
  }
  pLVar2 = DefaultLogger::get();
  if (bVar3 != 0) {
    Logger::info(pLVar2,"CalcTangentsProcess finished. Tangents have been calculated");
    return;
  }
  Logger::debug(pLVar2,"CalcTangentsProcess finished");
  return;
}

Assistant:

void CalcTangentsProcess::Execute( aiScene* pScene)
{
    ai_assert( NULL != pScene );

    ASSIMP_LOG_DEBUG("CalcTangentsProcess begin");

    bool bHas = false;
    for ( unsigned int a = 0; a < pScene->mNumMeshes; a++ ) {
        if(ProcessMesh( pScene->mMeshes[a],a))bHas = true;
    }

    if ( bHas ) {
        ASSIMP_LOG_INFO("CalcTangentsProcess finished. Tangents have been calculated");
    } else {
        ASSIMP_LOG_DEBUG("CalcTangentsProcess finished");
    }
}